

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecs.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
FastPForLib::IntegerCODEC::uncompress
          (IntegerCODEC *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *compresseddata,
          size_t expected_uncompressed_size)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  size_type sVar1;
  reference pvVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  long *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  NotEnoughStorage *nes;
  size_t memavailable;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *data;
  allocator_type *in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff78;
  size_type __n;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff80;
  size_type local_40 [3];
  undefined1 local_21;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_18;
  
  local_21 = 0;
  local_18 = in_RDX;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1effa8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1effcb);
  local_40[0] = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDI);
  __n = 0;
  this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_18,0);
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_18);
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI,__n);
  (**(code **)(*in_RSI + 0x10))(in_RSI,this_00,sVar1,pvVar2,local_40);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(this_00,__n);
  return in_RDI;
}

Assistant:

virtual std::vector<uint32_t>
  uncompress(const std::vector<uint32_t> &compresseddata,
             size_t expected_uncompressed_size = 0) {
    std::vector<uint32_t> data(
        expected_uncompressed_size); // allocate plenty of memory
    size_t memavailable = data.size();
    try {
      decodeArray(&compresseddata[0], compresseddata.size(), &data[0],
                  memavailable);
    } catch (NotEnoughStorage &nes) {
      data.resize(nes.required + 1024);
      decodeArray(&compresseddata[0], compresseddata.size(), &data[0],
                  memavailable);
    }
    data.resize(memavailable);
    return data;
  }